

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-interp.cc
# Opt level: O0

void __thiscall
InterpGCTest_Collect_TableCycle_Test::TestBody(InterpGCTest_Collect_TableCycle_Test *this)

{
  Limits limits;
  bool bVar1;
  Table *pTVar2;
  Table *pTVar3;
  Ref RVar4;
  char *pcVar5;
  AssertHelper local_1b0;
  Message local_1a8;
  Index local_1a0;
  undefined1 local_198 [8];
  AssertionResult gtest_ar_1;
  Message local_180;
  unsigned_long local_178;
  undefined1 local_170 [8];
  AssertionResult gtest_ar;
  Index after_new;
  TableType local_118;
  undefined1 local_f0 [8];
  Ptr t3;
  undefined1 local_b0 [8];
  Ptr t2;
  undefined1 local_70 [8];
  Ptr t1;
  undefined8 local_50;
  undefined8 local_48;
  ValueType local_3c;
  undefined1 local_38 [8];
  TableType tt;
  InterpGCTest_Collect_TableCycle_Test *this_local;
  
  tt.limits._16_8_ = this;
  wabt::Type::Type(&local_3c,Anyref);
  wabt::Limits::Limits((Limits *)&t1.root_index_,2);
  limits.max = local_50;
  limits.initial = t1.root_index_;
  limits._16_8_ = local_48;
  wabt::interp::TableType::TableType((TableType *)local_38,local_3c,limits);
  wabt::interp::TableType::TableType((TableType *)&t2.root_index_,(TableType *)local_38);
  wabt::interp::Table::New
            ((Ptr *)local_70,&(this->super_InterpGCTest).super_InterpTest.store_,
             (TableType *)&t2.root_index_);
  wabt::interp::TableType::~TableType((TableType *)&t2.root_index_);
  wabt::interp::TableType::TableType((TableType *)&t3.root_index_,(TableType *)local_38);
  wabt::interp::Table::New
            ((Ptr *)local_b0,&(this->super_InterpGCTest).super_InterpTest.store_,
             (TableType *)&t3.root_index_);
  wabt::interp::TableType::~TableType((TableType *)&t3.root_index_);
  wabt::interp::TableType::TableType(&local_118,(TableType *)local_38);
  wabt::interp::Table::New
            ((Ptr *)local_f0,&(this->super_InterpGCTest).super_InterpTest.store_,&local_118);
  wabt::interp::TableType::~TableType(&local_118);
  pTVar2 = wabt::interp::RefPtr<wabt::interp::Table>::operator->
                     ((RefPtr<wabt::interp::Table> *)local_70);
  pTVar3 = wabt::interp::RefPtr<wabt::interp::Table>::operator->
                     ((RefPtr<wabt::interp::Table> *)local_70);
  RVar4 = wabt::interp::Object::self((Object *)pTVar3);
  wabt::interp::Table::Set(pTVar2,&(this->super_InterpGCTest).super_InterpTest.store_,0,RVar4);
  pTVar2 = wabt::interp::RefPtr<wabt::interp::Table>::operator->
                     ((RefPtr<wabt::interp::Table> *)local_b0);
  pTVar3 = wabt::interp::RefPtr<wabt::interp::Table>::operator->
                     ((RefPtr<wabt::interp::Table> *)local_f0);
  RVar4 = wabt::interp::Object::self((Object *)pTVar3);
  wabt::interp::Table::Set(pTVar2,&(this->super_InterpGCTest).super_InterpTest.store_,0,RVar4);
  pTVar2 = wabt::interp::RefPtr<wabt::interp::Table>::operator->
                     ((RefPtr<wabt::interp::Table> *)local_f0);
  pTVar3 = wabt::interp::RefPtr<wabt::interp::Table>::operator->
                     ((RefPtr<wabt::interp::Table> *)local_b0);
  RVar4 = wabt::interp::Object::self((Object *)pTVar3);
  wabt::interp::Table::Set(pTVar2,&(this->super_InterpGCTest).super_InterpTest.store_,0,RVar4);
  pTVar2 = wabt::interp::RefPtr<wabt::interp::Table>::operator->
                     ((RefPtr<wabt::interp::Table> *)local_f0);
  pTVar3 = wabt::interp::RefPtr<wabt::interp::Table>::operator->
                     ((RefPtr<wabt::interp::Table> *)local_70);
  RVar4 = wabt::interp::Object::self((Object *)pTVar3);
  wabt::interp::Table::Set(pTVar2,&(this->super_InterpGCTest).super_InterpTest.store_,1,RVar4);
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       wabt::interp::Store::object_count(&(this->super_InterpGCTest).super_InterpTest.store_);
  local_178 = (this->super_InterpGCTest).before_new + 3;
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_170,"before_new + 3","after_new",&local_178,
             (unsigned_long *)&gtest_ar.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
  if (!bVar1) {
    testing::Message::Message(&local_180);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_170);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-interp.cc"
               ,0x25c,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_180);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_180);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
  wabt::interp::RefPtr<wabt::interp::Table>::reset((RefPtr<wabt::interp::Table> *)local_70);
  wabt::interp::RefPtr<wabt::interp::Table>::reset((RefPtr<wabt::interp::Table> *)local_b0);
  wabt::interp::Store::Collect(&(this->super_InterpGCTest).super_InterpTest.store_);
  local_1a0 = wabt::interp::Store::object_count(&(this->super_InterpGCTest).super_InterpTest.store_)
  ;
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_198,"after_new","store_.object_count()",
             (unsigned_long *)&gtest_ar.message_,&local_1a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
  if (!bVar1) {
    testing::Message::Message(&local_1a8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_198);
    testing::internal::AssertHelper::AssertHelper
              (&local_1b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-interp.cc"
               ,0x262,pcVar5);
    testing::internal::AssertHelper::operator=(&local_1b0,&local_1a8);
    testing::internal::AssertHelper::~AssertHelper(&local_1b0);
    testing::Message::~Message(&local_1a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
  wabt::interp::RefPtr<wabt::interp::Table>::reset((RefPtr<wabt::interp::Table> *)local_f0);
  wabt::interp::RefPtr<wabt::interp::Table>::~RefPtr((RefPtr<wabt::interp::Table> *)local_f0);
  wabt::interp::RefPtr<wabt::interp::Table>::~RefPtr((RefPtr<wabt::interp::Table> *)local_b0);
  wabt::interp::RefPtr<wabt::interp::Table>::~RefPtr((RefPtr<wabt::interp::Table> *)local_70);
  wabt::interp::TableType::~TableType((TableType *)local_38);
  return;
}

Assistant:

TEST_F(InterpGCTest, Collect_TableCycle) {
  auto tt = TableType{ValueType::Anyref, Limits{2}};
  auto t1 = Table::New(store_, tt);
  auto t2 = Table::New(store_, tt);
  auto t3 = Table::New(store_, tt);

  t1->Set(store_, 0, t1->self());  // t1 references itself.
  t2->Set(store_, 0, t3->self());
  t3->Set(store_, 0, t2->self());  // t2 and t3 reference each other.
  t3->Set(store_, 1, t1->self());  // t3 also references t1.

  auto after_new = store_.object_count();
  EXPECT_EQ(before_new + 3, after_new);

  // Remove t1 and t2 roots, but their kept alive by t3.
  t1.reset();
  t2.reset();
  store_.Collect();
  EXPECT_EQ(after_new, store_.object_count());

  // Remove t3 root, now all should be removed.
  t3.reset();
}